

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::socks5_stream::handshake4<libtorrent::aux::peer_connection::start()::__0>
          (socks5_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  bool bVar1;
  byte bVar2;
  __0 local_78 [16];
  _Vector_impl local_68;
  error_code local_50;
  error_code local_40;
  uint local_30;
  uint local_2c;
  int status;
  int version;
  char *p;
  anon_class_16_1_898a5c2a *h_local;
  error_code *e_local;
  socks5_stream *this_local;
  
  p = (char *)h;
  h_local = (anon_class_16_1_898a5c2a *)e;
  e_local = (error_code *)this;
  bVar1 = libtorrent::aux::proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    _status = ::std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
    bVar2 = libtorrent::aux::read_uint8<char*>((char **)&status);
    local_2c = (uint)bVar2;
    bVar2 = libtorrent::aux::read_uint8<char*>((char **)&status);
    local_30 = (uint)bVar2;
    if (local_2c == 1) {
      if (local_30 == 0) {
        local_68.super__Tp_alloc_type = (_Tp_alloc_type)0x0;
        local_68._1_7_ = 0;
        local_68._8_8_ = 0;
        local_68._16_8_ = 0;
        ::std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_68);
        ::std::vector<char,_std::allocator<char>_>::swap
                  ((vector<char,_std::allocator<char>_> *)&local_68,&this->m_buffer);
        ::std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&local_68);
        libtorrent::aux::peer_connection::start()::$_0::__0(local_78,h);
        socks_connect<libtorrent::aux::peer_connection::start()::__0>
                  (this,(anon_class_16_1_898a5c2a *)local_78);
        libtorrent::aux::peer_connection::start()::$_0::~__0(local_78);
      }
      else {
        boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                  (&local_50,authentication_error,(type *)0x0);
        libtorrent::aux::peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,&local_50);
      }
    }
    else {
      boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                (&local_40,unsupported_authentication_version,(type *)0x0);
      libtorrent::aux::peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,&local_40);
    }
  }
  return;
}

Assistant:

void handshake4(error_code const& e, Handler h)
	{
		COMPLETE_ASYNC("socks5_stream::handshake4");
		if (handle_error(e, std::move(h))) return;

		using namespace libtorrent::aux;

		char* p = &m_buffer[0];
		int version = read_uint8(p);
		int status = read_uint8(p);

		if (version != 1)
		{
			std::move(h)(error_code(socks_error::unsupported_authentication_version));
			return;
		}

		if (status != 0)
		{
			std::move(h)(error_code(socks_error::authentication_error));
			return;
		}

		std::vector<char>().swap(m_buffer);
		socks_connect(std::move(h));
	}